

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.hpp
# Opt level: O0

bool __thiscall mp::NLSolver::LoadModel<mp::NLFeeder_Easy>(NLSolver *this,NLFeeder_Easy *nlf)

{
  ulong uVar1;
  NLSolver *in_RDI;
  WriteNLResult result;
  NLUtils *in_stack_000006c8;
  NLFeeder_Easy *in_stack_000006d0;
  string *in_stack_000006d8;
  NLSolver *in_stack_000027d0;
  string local_60 [32];
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  
  GetFileStub_abi_cxx11_(in_RDI);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    InitAutoStub(in_stack_000027d0);
  }
  GetFileStub_abi_cxx11_(in_RDI);
  Utils(in_RDI);
  WriteNLFile<mp::NLFeeder_Easy>(in_stack_000006d8,in_stack_000006d0,in_stack_000006c8);
  if (in_stack_ffffffffffffffc0 != 1) {
    std::operator+(in_stack_ffffffffffffffc8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    std::__cxx11::string::operator=((string *)&in_RDI->err_msg_,local_60);
    std::__cxx11::string::~string(local_60);
  }
  std::
  pair<NLW2_WriteNLResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<NLW2_WriteNLResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x12a479);
  return in_stack_ffffffffffffffc0 == 1;
}

Assistant:

bool NLSolver::LoadModel(NLFeeder& nlf) {
  if (GetFileStub().empty())
    InitAutoStub();
  auto result = mp::WriteNLFile(GetFileStub(), nlf, Utils());
  if (NLW2_WriteNL_OK != result.first)
    return (err_msg_ = "WriteNL error: " + result.second, false);
  return true;
}